

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::ClearFreeMemory(ImDrawList *this)

{
  int *piVar1;
  uint uVar2;
  ImDrawCmd *pIVar3;
  unsigned_short *puVar4;
  ImDrawVert *pIVar5;
  ImVec4 *pIVar6;
  void **ppvVar7;
  ImVec2 *pIVar8;
  ImDrawChannel *pIVar9;
  void *pvVar10;
  ImGuiContext *pIVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  
  pIVar3 = (this->CmdBuffer).Data;
  if (pIVar3 != (ImDrawCmd *)0x0) {
    (this->CmdBuffer).Size = 0;
    pIVar11 = GImGui;
    (this->CmdBuffer).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar11->IO).MemFreeFn)(pIVar3);
    (this->CmdBuffer).Data = (ImDrawCmd *)0x0;
  }
  puVar4 = (this->IdxBuffer).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    (this->IdxBuffer).Size = 0;
    pIVar11 = GImGui;
    (this->IdxBuffer).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar11->IO).MemFreeFn)(puVar4);
    (this->IdxBuffer).Data = (unsigned_short *)0x0;
  }
  pIVar5 = (this->VtxBuffer).Data;
  if (pIVar5 != (ImDrawVert *)0x0) {
    (this->VtxBuffer).Size = 0;
    pIVar11 = GImGui;
    (this->VtxBuffer).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar11->IO).MemFreeFn)(pIVar5);
    (this->VtxBuffer).Data = (ImDrawVert *)0x0;
  }
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)0x0;
  this->_IdxWritePtr = (ImDrawIdx *)0x0;
  pIVar6 = (this->_ClipRectStack).Data;
  if (pIVar6 != (ImVec4 *)0x0) {
    (this->_ClipRectStack).Size = 0;
    pIVar11 = GImGui;
    (this->_ClipRectStack).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar11->IO).MemFreeFn)(pIVar6);
    (this->_ClipRectStack).Data = (ImVec4 *)0x0;
  }
  ppvVar7 = (this->_TextureIdStack).Data;
  if (ppvVar7 != (void **)0x0) {
    (this->_TextureIdStack).Size = 0;
    pIVar11 = GImGui;
    (this->_TextureIdStack).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar11->IO).MemFreeFn)(ppvVar7);
    (this->_TextureIdStack).Data = (void **)0x0;
  }
  pIVar8 = (this->_Path).Data;
  if (pIVar8 != (ImVec2 *)0x0) {
    (this->_Path).Size = 0;
    pIVar11 = GImGui;
    (this->_Path).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar11->IO).MemFreeFn)(pIVar8);
    (this->_Path).Data = (ImVec2 *)0x0;
  }
  this->_ChannelsCurrent = 0;
  this->_ChannelsCount = 1;
  uVar2 = (this->_Channels).Size;
  uVar12 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      if (lVar14 == 0) {
        if ((int)uVar12 < 1) goto LAB_00132abe;
        pIVar9 = (this->_Channels).Data;
        (pIVar9->IdxBuffer).Size = 0;
        (pIVar9->IdxBuffer).Capacity = 0;
        (pIVar9->IdxBuffer).Data = (unsigned_short *)0x0;
        (pIVar9->CmdBuffer).Size = 0;
        (pIVar9->CmdBuffer).Capacity = 0;
        (pIVar9->CmdBuffer).Data = (ImDrawCmd *)0x0;
      }
      if ((this->_Channels).Size <= lVar13) {
LAB_00132abe:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                      ,0x353,
                      "value_type &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
      }
      pIVar9 = (this->_Channels).Data;
      pvVar10 = *(void **)((long)&(pIVar9->CmdBuffer).Data + lVar14);
      if (pvVar10 != (void *)0x0) {
        *(undefined8 *)((long)&(pIVar9->CmdBuffer).Size + lVar14) = 0;
        pIVar11 = GImGui;
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
        (*(pIVar11->IO).MemFreeFn)(pvVar10);
        *(undefined8 *)((long)&(pIVar9->CmdBuffer).Data + lVar14) = 0;
      }
      if ((this->_Channels).Size <= lVar13) goto LAB_00132abe;
      pIVar9 = (this->_Channels).Data;
      pvVar10 = *(void **)((long)&(pIVar9->IdxBuffer).Data + lVar14);
      if (pvVar10 != (void *)0x0) {
        *(undefined8 *)((long)&(pIVar9->IdxBuffer).Size + lVar14) = 0;
        pIVar11 = GImGui;
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
        (*(pIVar11->IO).MemFreeFn)(pvVar10);
        *(undefined8 *)((long)&(pIVar9->IdxBuffer).Data + lVar14) = 0;
      }
      lVar13 = lVar13 + 1;
      uVar12 = (ulong)(this->_Channels).Size;
      lVar14 = lVar14 + 0x20;
    } while (lVar13 < (long)uVar12);
  }
  pIVar9 = (this->_Channels).Data;
  if (pIVar9 != (ImDrawChannel *)0x0) {
    (this->_Channels).Size = 0;
    pIVar11 = GImGui;
    (this->_Channels).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar11->IO).MemFreeFn)(pIVar9);
    (this->_Channels).Data = (ImDrawChannel *)0x0;
  }
  return;
}

Assistant:

void ImDrawList::ClearFreeMemory()
{
    CmdBuffer.clear();
    IdxBuffer.clear();
    VtxBuffer.clear();
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.clear();
    _TextureIdStack.clear();
    _Path.clear();
    _ChannelsCurrent = 0;
    _ChannelsCount = 1;
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == 0) memset(&_Channels[0], 0, sizeof(_Channels[0]));  // channel 0 is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i].CmdBuffer.clear();
        _Channels[i].IdxBuffer.clear();
    }
    _Channels.clear();
}